

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O2

void __thiscall
ModListIRCCommand::trigger
          (ModListIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  _List_node_base *p_Var6;
  long *plVar7;
  string_view in_key;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  undefined1 auVar8 [16];
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  p_Var6 = (_List_node_base *)&pluginInstance.groups;
  bVar3 = false;
  while (p_Var6 = (((_List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                     *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)0x11a670) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (p_Var6 + 2));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (p_Var6 + 6));
    string_printf_abi_cxx11_
              (&local_70,"\x0f (Access: %d): ",(ulong)*(uint *)((long)(p_Var6 + 1) + 8));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&msg,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    sVar1 = msg._M_string_length;
    Jupiter::Plugin::getConfig();
    lVar4 = Jupiter::Config::getSections_abi_cxx11_();
    plVar7 = (long *)(lVar4 + 0x10);
    while (plVar7 = (long *)*plVar7, plVar7 != (long *)0x0) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      auVar8 = Jupiter::Config::get((Config *)(plVar7 + 5),5,"Group",0,0);
      lhs._M_str = (char *)(p_Var6 + 6);
      lhs._M_len = auVar8._8_8_;
      bVar2 = jessilib::equalsi<char,char>(auVar8._0_8_,lhs,pbVar5);
      if (bVar2) {
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Jupiter::Config::getName_abi_cxx11_();
        std::__cxx11::string::string((string *)&local_50,pbVar5);
        in_key._M_str = "Name";
        in_key._M_len = 4;
        Jupiter::Config::get<std::__cxx11::string>
                  (&local_70,(Config *)(plVar7 + 5),in_key,&local_50);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&msg,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_70._M_dataplus._M_p = (pointer)0x2;
        local_70._M_string_length = 0x1147ea;
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
      }
    }
    if (msg._M_string_length != sVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&msg);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&msg);
      bVar3 = true;
      Jupiter::IRC::Client::sendMessage
                (source,channel._M_len,channel._M_str,msg._M_string_length,msg._M_dataplus._M_p);
    }
  }
  if (!bVar3) {
    Jupiter::IRC::Client::sendMessage
              (source,channel._M_len,channel._M_str,0x23,"There are no configured moderators.");
  }
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void ModListIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	std::string msg;
	size_t msgBaseSize;
	bool haveMods = false;
	for (auto node = pluginInstance.groups.begin(); node != pluginInstance.groups.end(); ++node) {
		msg = node->prefix;
		msg += node->name;
		msg += string_printf(IRCNORMAL " (Access: %d): ", node->access);
		msgBaseSize = msg.size();

		for (auto& section : pluginInstance.getConfig().getSections()) {
			if (jessilib::equalsi(section.second.get("Group"sv), node->name)) {
				msg += section.second.get("Name"sv, section.second.getName());
				msg += ", "sv;
			}
		}

		if (msg.size() != msgBaseSize) {
			msg.pop_back(); // ' '
			msg.pop_back(); // ','
			source->sendMessage(channel, msg);
			haveMods = true;
		}
	}
	if (!haveMods)
		source->sendMessage(channel, "There are no configured moderators."sv);
}